

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix2 * matrix2_invert(matrix2 *self)

{
  matrix2 *pmVar1;
  matrix2 inverse;
  anon_union_16_5_d0a4420b_for_matrix2_0 local_18;
  
  pmVar1 = matrix2_inverse(self,(matrix2 *)&local_18.field_1);
  if (pmVar1 != (matrix2 *)0x0) {
    (self->field_0).field_1.m22[0] = local_18.field_1.m22[0];
    (self->field_0).field_1.m22[1] = local_18.field_1.m22[1];
  }
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_invert(struct matrix2 *self)
{
	struct matrix2 inverse;
	uint8_t i;

	if (matrix2_inverse(self, &inverse)) {
		for (i = 0; i < 4; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}